

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref.h
# Opt level: O3

uint __thiscall
embree::TutorialScene::materialID
          (TutorialScene *this,Ref<embree::SceneGraph::MaterialNode> *material)

{
  uint uVar1;
  
  uVar1 = (material->ptr->super_Node).id;
  if (uVar1 != 0xffffffff) {
    return uVar1;
  }
  std::
  vector<embree::Ref<embree::SceneGraph::MaterialNode>,_std::allocator<embree::Ref<embree::SceneGraph::MaterialNode>_>_>
  ::push_back(&this->materials,material);
  (material->ptr->super_Node).id =
       (int)((ulong)((long)(this->materials).
                           super__Vector_base<embree::Ref<embree::SceneGraph::MaterialNode>,_std::allocator<embree::Ref<embree::SceneGraph::MaterialNode>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->materials).
                          super__Vector_base<embree::Ref<embree::SceneGraph::MaterialNode>,_std::allocator<embree::Ref<embree::SceneGraph::MaterialNode>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 3) - 1;
  return (material->ptr->super_Node).id;
}

Assistant:

__forceinline       Type* operator ->()       { return  ptr; }